

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_image_simd.cpp
# Opt level: O1

void compute_integral_img_simd_int(uint8_t *gray_image,integral_image *iimage)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [32];
  undefined8 uVar17;
  byte bVar18;
  byte bVar19;
  long lVar20;
  float fVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  uint uVar26;
  byte *pbVar27;
  float *pfVar28;
  uint8_t *puVar29;
  float *pfVar30;
  int iVar31;
  ulong uVar32;
  float *pfVar33;
  long lVar34;
  long lVar35;
  ushort uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  
  auVar16 = _DAT_001b3720;
  lVar20 = (long)iimage->data_width;
  uVar1 = iimage->width;
  uVar23 = (ulong)(int)uVar1;
  uVar2 = iimage->height;
  pfVar30 = iimage->data;
  uVar26 = uVar1;
  if ((long)uVar23 < 0) {
    uVar26 = uVar1 + 3;
  }
  if (uVar1 + 3 < 7) {
    uVar32 = 0;
  }
  else {
    uVar32 = 0;
    auVar39 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar38 = vpermt2b_avx512vl(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar16,
                                  ZEXT432(*(uint *)(gray_image + uVar32)));
      auVar38 = vpsadbw_avx2(auVar38,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      auVar38 = vpaddd_avx2(auVar38,auVar39._0_32_);
      auVar37 = vpmovqd_avx512vl(auVar38);
      *(undefined1 (*) [16])(pfVar30 + uVar32) = auVar37;
      auVar38 = vpermq_avx2(auVar38,0xff);
      auVar39 = ZEXT3264(auVar38);
      uVar32 = uVar32 + 4;
    } while (uVar32 < (ulong)(long)(int)(uVar26 & 0xfffffffc));
  }
  if (uVar32 < uVar23) {
    fVar21 = pfVar30[uVar32 - 1];
    do {
      fVar21 = (float)((int)fVar21 + (uint)gray_image[uVar32]);
      pfVar30[uVar32] = fVar21;
      uVar32 = uVar32 + 1;
    } while (uVar23 != uVar32);
  }
  auVar16 = _DAT_001b3720;
  if (1 < uVar2) {
    puVar29 = gray_image + uVar23;
    lVar34 = 1;
    lVar35 = 0;
    pfVar28 = pfVar30;
    pfVar33 = pfVar30 + lVar20;
    do {
      if (uVar1 + 3 < 7) {
        uVar32 = 0;
      }
      else {
        auVar39 = ZEXT1664((undefined1  [16])0x0);
        uVar32 = 0;
        do {
          auVar38 = vpermt2b_avx512vl(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar16,
                                      ZEXT432(*(uint *)(puVar29 + uVar32)));
          auVar38 = vpsadbw_avx2(auVar38,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          auVar38 = vpaddd_avx2(auVar38,auVar39._0_32_);
          auVar37 = vpmovqd_avx512vl(auVar38);
          auVar37 = vpaddd_avx(auVar37,*(undefined1 (*) [16])(pfVar28 + uVar32));
          *(undefined1 (*) [16])(pfVar33 + uVar32) = auVar37;
          auVar38 = vpermq_avx2(auVar38,0xff);
          auVar39 = ZEXT3264(auVar38);
          uVar32 = uVar32 + 4;
        } while (uVar32 < (ulong)(long)(int)(uVar26 & 0xfffffffc));
      }
      lVar22 = uVar23 - uVar32;
      if (uVar32 <= uVar23 && lVar22 != 0) {
        iVar31 = (int)pfVar30[lVar34 * lVar20 + (uVar32 - 1)] -
                 (int)pfVar30[(lVar34 + -1) * lVar20 + (uVar32 - 1)];
        pbVar27 = puVar29 + uVar32;
        lVar25 = uVar32 + lVar35;
        do {
          iVar31 = iVar31 + (uint)*pbVar27;
          (pfVar30 + lVar20)[lVar25] = (float)((int)pfVar30[lVar25] + iVar31);
          pbVar27 = pbVar27 + 1;
          lVar25 = lVar25 + 1;
          lVar22 = lVar22 + -1;
        } while (lVar22 != 0);
      }
      lVar34 = lVar34 + 1;
      pfVar33 = pfVar33 + lVar20;
      pfVar28 = pfVar28 + lVar20;
      puVar29 = puVar29 + uVar23;
      lVar35 = lVar35 + lVar20;
    } while (lVar34 != (int)uVar2);
  }
  if (uVar2 != 0) {
    pfVar28 = iimage->data;
    lVar34 = 0;
    auVar39 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar40 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar41 = vbroadcastss_avx512f(ZEXT416(0x3b808081));
    do {
      uVar32 = 0;
      if ((int)(uVar23 - 7) != 0) {
        do {
          auVar16 = vcvtdq2ps_avx(*(undefined1 (*) [32])(pfVar30 + uVar32));
          pfVar33 = pfVar28 + uVar32;
          *pfVar33 = auVar16._0_4_ * 0.003921569;
          pfVar33[1] = auVar16._4_4_ * 0.003921569;
          pfVar33[2] = auVar16._8_4_ * 0.003921569;
          pfVar33[3] = auVar16._12_4_ * 0.003921569;
          pfVar33[4] = auVar16._16_4_ * 0.003921569;
          pfVar33[5] = auVar16._20_4_ * 0.003921569;
          pfVar33[6] = auVar16._24_4_ * 0.003921569;
          pfVar33[7] = auVar16._28_4_;
          uVar32 = uVar32 + 8;
        } while (uVar32 < uVar23 - 7);
      }
      if (uVar32 <= uVar23 && uVar23 - uVar32 != 0) {
        auVar42 = vpbroadcastq_avx512f();
        uVar24 = 0;
        do {
          auVar43 = vpbroadcastq_avx512f();
          auVar44 = vporq_avx512f(auVar43,auVar39);
          auVar43 = vporq_avx512f(auVar43,auVar40);
          uVar17 = vpcmpuq_avx512f(auVar43,auVar42,2);
          bVar18 = (byte)uVar17;
          uVar17 = vpcmpuq_avx512f(auVar44,auVar42,2);
          bVar19 = (byte)uVar17;
          uVar36 = CONCAT11(bVar19,bVar18);
          auVar43 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pfVar30 + uVar32 + uVar24));
          auVar44._4_4_ = (uint)((byte)(uVar36 >> 1) & 1) * auVar43._4_4_;
          auVar44._0_4_ = (uint)(bVar18 & 1) * auVar43._0_4_;
          auVar44._8_4_ = (uint)((byte)(uVar36 >> 2) & 1) * auVar43._8_4_;
          auVar44._12_4_ = (uint)((byte)(uVar36 >> 3) & 1) * auVar43._12_4_;
          auVar44._16_4_ = (uint)((byte)(uVar36 >> 4) & 1) * auVar43._16_4_;
          auVar44._20_4_ = (uint)((byte)(uVar36 >> 5) & 1) * auVar43._20_4_;
          auVar44._24_4_ = (uint)((byte)(uVar36 >> 6) & 1) * auVar43._24_4_;
          auVar44._28_4_ = (uint)((byte)(uVar36 >> 7) & 1) * auVar43._28_4_;
          auVar44._32_4_ = (uint)(bVar19 & 1) * auVar43._32_4_;
          auVar44._36_4_ = (uint)(bVar19 >> 1 & 1) * auVar43._36_4_;
          auVar44._40_4_ = (uint)(bVar19 >> 2 & 1) * auVar43._40_4_;
          auVar44._44_4_ = (uint)(bVar19 >> 3 & 1) * auVar43._44_4_;
          auVar44._48_4_ = (uint)(bVar19 >> 4 & 1) * auVar43._48_4_;
          auVar44._52_4_ = (uint)(bVar19 >> 5 & 1) * auVar43._52_4_;
          auVar44._56_4_ = (uint)(bVar19 >> 6 & 1) * auVar43._56_4_;
          auVar44._60_4_ = (uint)(bVar19 >> 7) * auVar43._60_4_;
          auVar43 = vcvtudq2ps_avx512f(auVar44);
          auVar43 = vmulps_avx512f(auVar43,auVar41);
          pfVar33 = pfVar28 + uVar32 + uVar24;
          bVar3 = (bool)((byte)(uVar36 >> 1) & 1);
          bVar4 = (bool)((byte)(uVar36 >> 2) & 1);
          bVar5 = (bool)((byte)(uVar36 >> 3) & 1);
          bVar6 = (bool)((byte)(uVar36 >> 4) & 1);
          bVar7 = (bool)((byte)(uVar36 >> 5) & 1);
          bVar8 = (bool)((byte)(uVar36 >> 6) & 1);
          bVar9 = (bool)((byte)(uVar36 >> 7) & 1);
          bVar10 = (bool)(bVar19 >> 1 & 1);
          bVar11 = (bool)(bVar19 >> 2 & 1);
          bVar12 = (bool)(bVar19 >> 3 & 1);
          bVar13 = (bool)(bVar19 >> 4 & 1);
          bVar14 = (bool)(bVar19 >> 5 & 1);
          bVar15 = (bool)(bVar19 >> 6 & 1);
          *pfVar33 = (float)((uint)(bVar18 & 1) * auVar43._0_4_ |
                            (uint)!(bool)(bVar18 & 1) * (int)*pfVar33);
          pfVar33[1] = (float)((uint)bVar3 * auVar43._4_4_ | (uint)!bVar3 * (int)pfVar33[1]);
          pfVar33[2] = (float)((uint)bVar4 * auVar43._8_4_ | (uint)!bVar4 * (int)pfVar33[2]);
          pfVar33[3] = (float)((uint)bVar5 * auVar43._12_4_ | (uint)!bVar5 * (int)pfVar33[3]);
          pfVar33[4] = (float)((uint)bVar6 * auVar43._16_4_ | (uint)!bVar6 * (int)pfVar33[4]);
          pfVar33[5] = (float)((uint)bVar7 * auVar43._20_4_ | (uint)!bVar7 * (int)pfVar33[5]);
          pfVar33[6] = (float)((uint)bVar8 * auVar43._24_4_ | (uint)!bVar8 * (int)pfVar33[6]);
          pfVar33[7] = (float)((uint)bVar9 * auVar43._28_4_ | (uint)!bVar9 * (int)pfVar33[7]);
          pfVar33[8] = (float)((uint)(bVar19 & 1) * auVar43._32_4_ |
                              (uint)!(bool)(bVar19 & 1) * (int)pfVar33[8]);
          pfVar33[9] = (float)((uint)bVar10 * auVar43._36_4_ | (uint)!bVar10 * (int)pfVar33[9]);
          pfVar33[10] = (float)((uint)bVar11 * auVar43._40_4_ | (uint)!bVar11 * (int)pfVar33[10]);
          pfVar33[0xb] = (float)((uint)bVar12 * auVar43._44_4_ | (uint)!bVar12 * (int)pfVar33[0xb]);
          pfVar33[0xc] = (float)((uint)bVar13 * auVar43._48_4_ | (uint)!bVar13 * (int)pfVar33[0xc]);
          pfVar33[0xd] = (float)((uint)bVar14 * auVar43._52_4_ | (uint)!bVar14 * (int)pfVar33[0xd]);
          pfVar33[0xe] = (float)((uint)bVar15 * auVar43._56_4_ | (uint)!bVar15 * (int)pfVar33[0xe]);
          pfVar33[0xf] = (float)((uint)(bVar19 >> 7) * auVar43._60_4_ |
                                (uint)!(bool)(bVar19 >> 7) * (int)pfVar33[0xf]);
          uVar24 = uVar24 + 0x10;
        } while (((uVar23 - uVar32) + 0xf & 0xfffffffffffffff0) != uVar24);
      }
      lVar34 = lVar34 + 1;
      pfVar28 = pfVar28 + lVar20;
      pfVar30 = pfVar30 + lVar20;
    } while (lVar34 != (int)uVar2);
  }
  return;
}

Assistant:

void compute_integral_img_simd_int(uint8_t *gray_image, struct integral_image *iimage) {
    
    // Implementation adapted from:
    // https://stackoverflow.com/questions/46520275/how-to-speed-up-calculation-of-integral-image
    // https://github.com/ermig1979/Simd/blob/master/src/Simd/SimdAvx2Integral.cpp

    int data_width = iimage->data_width;
    int width = iimage->width;
    int height = iimage->height;

    __m256i MASK = _mm256_setr_epi64x(0x00000000000000FF, 0x000000000000FFFF, 0x0000000000FFFFFF, 0x00000000FFFFFFFF);
    __m256i PACK = _mm256_setr_epi32(0, 2, 4, 6, 1, 3, 5, 7);
    //__m256i ZERO = _mm256_set1_epi32(0);
    __m256i ZERO = _mm256_setzero_si256();

    uint32_t *iimage_idata = (uint32_t *) iimage->data;

    size_t aligned_width = width / 4 * 4;

    {
        __m256i row_sums = ZERO;
        size_t i = 0;
        for(; i < aligned_width; i+=4) {

            // If (gray_image + i) has following uint8_t pixels: a b c d
            // a0000000 ab000000 abc00000 abcd0000
            __m256i img_rep_mask = _mm256_and_si256(_mm256_set1_epi32(*(uint32_t*)(gray_image + i)), MASK);
            
            // Summing together blocks of 8 uint8_t's and storing results
            // uint32_t eeee = a
            // uint32_t ffff = a + b
            // uint32_t gggg = a + b + c
            // uint32_t hhhh = a + b + c + d
            // eeee0000 ffff0000 gggg0000 hhhh0000
            __m256i img_sad_sum = _mm256_sad_epu8(img_rep_mask, ZERO);

            // Updating row_sum by adding previously computed img_sad_sum
            //   eeee0000 ffff0000 hhhh0000 hhhh0000
            // + iiii**** jjjj**** kkkk**** llll****
            // -------------------------------------
            //   mmmm**** nnnn**** oooo**** pppp****
            row_sums = _mm256_add_epi32(row_sums, img_sad_sum);

            // Permuting row_sum from first row to second and cutting off upper 128 bits
            // mmmm**** nnnn**** oooo**** pppp****
            // mmmmnnnn oooopppp ******** ********
            __m128i curr_row_sums = _mm256_castsi256_si128(_mm256_permutevar8x32_epi32(row_sums, PACK));
            
            // Storing 128 bits (4*uint32_t) in curr_row_sums back to memory
            // 
            _mm_storeu_si128((__m128i*)(iimage_idata + i), curr_row_sums); // For unaligned
            //_mm_store_si128((__m128i *)(iimage_idata + i), curr_row_sums);
            
            // Updating row_sums to only include highest of four values (pppp)
            // mmmm**** nnnn**** oooo**** pppp****
            // pppp**** pppp**** pppp**** pppp****
            row_sums = _mm256_permute4x64_epi64(row_sums, 0xFF);

        }
        uint32_t row_sum = iimage_idata[i - 1];
        for (; i < width; ++i) {
            row_sum += gray_image[i];
            iimage_idata[i] = row_sum;
        }
    }

    for(size_t j = 1; j < height; ++j) {

        __m256i row_sums = ZERO;

        size_t i = 0;
        for(; i < aligned_width; i+=4) {

            // If (gray_image + i) has following uint8_t pixels: a b c d
            // a0000000 ab000000 abc00000 abcd0000
            __m256i img_rep_mask = _mm256_and_si256(_mm256_set1_epi32(*(uint32_t*)(gray_image + j * width + i)), MASK);
            
            // Summing together blocks of 8 uint8_t's and storing results
            // uint32_t eeee = a
            // uint32_t ffff = a + b
            // uint32_t gggg = a + b + c
            // uint32_t hhhh = a + b + c + d
            // eeee0000 ffff0000 gggg0000 hhhh0000
            __m256i img_sad_sum = _mm256_sad_epu8(img_rep_mask, ZERO);

            // Updating row_sum by adding previously computed img_sad_sum
            //   eeee0000 ffff0000 hhhh0000 hhhh0000
            // + iiii**** jjjj**** kkkk**** llll****
            // -------------------------------------
            //   mmmm**** nnnn**** oooo**** pppp****
            row_sums = _mm256_add_epi32(row_sums, img_sad_sum);

            // Permuting row_sum from first row to second and cutting off upper 128 bits
            // mmmm**** nnnn**** oooo**** pppp****
            // mmmmnnnn oooopppp ******** ********
            __m128i curr_row_sums = _mm256_castsi256_si128(_mm256_permutevar8x32_epi32(row_sums, PACK));

            // Loading row_sum from previous row
            __m128i prev_row_sums = _mm_loadu_si128((__m128i *)(iimage_idata + (j-1) * data_width + i));
            //__m128i prev_row_sums = _mm_load_si128((__m128i *)(iimage_idata + (j-1) * data_width + i));

            // Adding curr_row_sums with prev_row_sums
            __m128i add_row_sums = _mm_add_epi32(curr_row_sums, prev_row_sums);

            // Storing 128 bits (4*uint32_t) in curr_row_sums back to memory
            _mm_storeu_si128((__m128i *)(iimage_idata + j * data_width + i), add_row_sums); // For unaligned
            //_mm_store_si128((__m128i *)(iimage_idata + j * data_width + i), add_row_sums);
            
            // Updating row_sums to only include highest of four values (pppp)
            // mmmm**** nnnn**** oooo**** pppp****
            // pppp**** pppp**** pppp**** pppp****
            row_sums = _mm256_permute4x64_epi64(row_sums, 0xFF);

        }

        uint32_t row_sum = iimage_idata[j * data_width + i - 1] - iimage_idata[(j-1) * data_width + i - 1];
        for (; i < width; ++i) {
            row_sum += gray_image[j * width + i];
            iimage_idata[j * data_width + i] = row_sum + iimage_idata[(j-1) * data_width + i];
        }

    }

    
    float *iimage_data = iimage->data;

    __m256 factor = _mm256_set1_ps(1.0f / 255.0f);

    for (size_t j = 0; j < height; ++j) {

        size_t i = 0;
        for (; i < width - 7; i+=8) {

            __m256i v_int = _mm256_loadu_si256((__m256i *)(iimage_idata + j * data_width + i));
            //__m256i v_int = _mm256_load_si256((__m256i *)(iimage_idata + j * data_width + i));

            // AVX512 only :(
            //__m256 v_float = _mm256_cvtepu32_ps(v_int);
            __m256 v_float = _mm256_cvtepi32_ps(v_int);
            //__m256 v_float = _my_mm256_cvtepu32_ps(v_int);

            // Multiplying converted float with (1.0f/255.0f) 
            __m256 v_iimage = _mm256_mul_ps(factor, v_float);

            // Storing value back to memory
            _mm256_storeu_ps(iimage_data + j * data_width + i, v_iimage);

        } 

        for (; i < width; ++i) {
            iimage_data[j * data_width + i] = (1.0f / 255.0f) * ((float) iimage_idata[j * data_width + i]);
        }

    }
    

}